

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O1

void __thiscall
Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::FunctionWithHomeObj
          (FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *this,FunctionProxy *proxy,
          ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ScriptFunctionWithInlineCache::ScriptFunctionWithInlineCache
            (&this->super_ScriptFunctionWithInlineCache,proxy,deferredPrototypeType);
  (this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)&PTR_Finalize_0153fbb8;
  (this->homeObj).ptr = (void *)0x0;
  if ((((proxy->functionInfo).ptr)->attributes & HomeObj) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x3b,"(proxy->GetFunctionInfo()->HasHomeObj())",
                                "proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionWithHomeObj(FunctionProxy* proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), homeObj(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasHomeObj());
        }